

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdIsFindPsbtRecord(void *handle,void *psbt_handle,int type,uint32_t index,char *key)

{
  bool bVar1;
  undefined8 uVar2;
  string *message;
  uint32_t in_ECX;
  int in_EDX;
  long in_RSI;
  char *in_R8;
  CfdException *except;
  exception *std_except;
  bool is_find;
  ByteData key_data;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  string *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  CfdError error_code;
  allocator *paVar3;
  undefined1 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe31;
  undefined1 in_stack_fffffffffffffe32;
  undefined1 in_stack_fffffffffffffe33;
  undefined4 in_stack_fffffffffffffe34;
  allocator local_169;
  string local_168 [32];
  CfdSourceLocation local_148;
  bool local_12a;
  allocator local_129;
  string local_128;
  ByteData local_108;
  undefined1 local_ea;
  allocator local_e9;
  string *in_stack_ffffffffffffff18;
  void *in_stack_ffffffffffffff20;
  CfdSourceLocation local_c8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [32];
  CfdSourceLocation local_88;
  long local_70;
  allocator local_61;
  string local_60 [52];
  undefined4 local_2c;
  char *local_28;
  uint32_t local_20;
  int local_1c;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  local_2c = 0xffffffff;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"PsbtHandle",&local_61);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_70 = local_18;
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (bVar1) {
    local_88.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_88.filename = local_88.filename + 1;
    local_88.line = 0x92b;
    local_88.funcname = "CfdIsFindPsbtRecord";
    cfd::core::logger::warn<>(&local_88,"key is null or empty.");
    local_aa = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"Failed to parameter. key is null or empty.",&local_a9);
    cfd::core::CfdException::CfdException
              ((CfdException *)
               CONCAT44(in_stack_fffffffffffffe34,
                        CONCAT13(in_stack_fffffffffffffe33,
                                 CONCAT12(in_stack_fffffffffffffe32,
                                          CONCAT11(in_stack_fffffffffffffe31,
                                                   in_stack_fffffffffffffe30)))),error_code,
               in_stack_fffffffffffffe20);
    local_aa = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_70 + 0x18) == 0) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0x931;
    local_c8.funcname = "CfdIsFindPsbtRecord";
    cfd::core::logger::warn<>(&local_c8,"psbt is null.");
    local_ea = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff18,"Failed to handle statement. psbt is null.",
               &local_e9);
    cfd::core::CfdException::CfdException
              ((CfdException *)
               CONCAT44(in_stack_fffffffffffffe34,
                        CONCAT13(in_stack_fffffffffffffe33,
                                 CONCAT12(in_stack_fffffffffffffe32,
                                          CONCAT11(in_stack_fffffffffffffe31,
                                                   in_stack_fffffffffffffe30)))),error_code,
               in_stack_fffffffffffffe20);
    local_ea = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,local_28,&local_129);
  cfd::core::ByteData::ByteData(&local_108,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  local_12a = true;
  if (local_1c == 1) {
    local_12a = cfd::core::Psbt::IsFindGlobalRecord(*(Psbt **)(local_70 + 0x18),&local_108);
  }
  else if (local_1c == 2) {
    local_12a = cfd::core::Psbt::IsFindTxInRecord(*(Psbt **)(local_70 + 0x18),local_20,&local_108);
  }
  else {
    if (local_1c != 3) {
      local_148.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                   ,0x2f);
      local_148.filename = local_148.filename + 1;
      local_148.line = 0x944;
      local_148.funcname = "CfdIsFindPsbtRecord";
      cfd::core::logger::warn<int&>(&local_148,"type is invalid: {}",&local_1c);
      message = (string *)__cxa_allocate_exception(0x30);
      paVar3 = &local_169;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_168,"Failed to parameter. type is invalid.",paVar3);
      cfd::core::CfdException::CfdException
                ((CfdException *)
                 CONCAT44(local_1c,CONCAT13(in_stack_fffffffffffffe33,
                                            CONCAT12(in_stack_fffffffffffffe32,
                                                     CONCAT11(in_stack_fffffffffffffe31,
                                                              in_stack_fffffffffffffe30)))),
                 (CfdError)((ulong)paVar3 >> 0x20),message);
      __cxa_throw(message,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
      ;
    }
    local_12a = cfd::core::Psbt::IsFindTxOutRecord(*(Psbt **)(local_70 + 0x18),local_20,&local_108);
  }
  if (local_12a == false) {
    local_4 = 8;
  }
  else {
    local_4 = 0;
  }
  cfd::core::ByteData::~ByteData((ByteData *)0x600544);
  return local_4;
}

Assistant:

int CfdIsFindPsbtRecord(
    void* handle, void* psbt_handle, int type, uint32_t index,
    const char* key) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(key)) {
      warn(CFD_LOG_SOURCE, "key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    ByteData key_data(key);
    bool is_find = true;
    switch (type) {
      case kCfdPsbtRecordTypeGlobal:
        is_find = psbt_obj->psbt->IsFindGlobalRecord(key_data);
        break;
      case kCfdPsbtRecordTypeInput:
        is_find = psbt_obj->psbt->IsFindTxInRecord(index, key_data);
        break;
      case kCfdPsbtRecordTypeOutput:
        is_find = psbt_obj->psbt->IsFindTxOutRecord(index, key_data);
        break;
      default:
        warn(CFD_LOG_SOURCE, "type is invalid: {}", type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. type is invalid.");
    }

    if (!is_find) return CfdErrorCode::kCfdNotFoundError;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}